

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonParseFillInParentage(JsonParse *pParse,u32 i,u32 iParent)

{
  JsonNode *pJVar1;
  int iVar2;
  uint uVar3;
  
  pJVar1 = pParse->aNode;
  pParse->aUp[i] = iParent;
  if (pJVar1[i].eType == '\x06') {
    if (pJVar1[i].n != 0) {
      uVar3 = 1;
      do {
        jsonParseFillInParentage(pParse,uVar3 + i,i);
        iVar2 = 1;
        if (5 < pJVar1[(ulong)i + (ulong)uVar3].eType) {
          iVar2 = pJVar1[(ulong)i + (ulong)uVar3].n + 1;
        }
        uVar3 = iVar2 + uVar3;
      } while (uVar3 <= pJVar1[i].n);
    }
  }
  else if ((pJVar1[i].eType == '\a') && (pJVar1[i].n != 0)) {
    uVar3 = 1;
    do {
      pParse->aUp[uVar3 + i] = i;
      jsonParseFillInParentage(pParse,uVar3 + i + 1,i);
      iVar2 = 2;
      if (5 < pJVar1[(ulong)i + (ulong)uVar3 + 1].eType) {
        iVar2 = pJVar1[(ulong)i + (ulong)uVar3 + 1].n + 2;
      }
      uVar3 = iVar2 + uVar3;
    } while (uVar3 <= pJVar1[i].n);
  }
  return;
}

Assistant:

static void jsonParseFillInParentage(JsonParse *pParse, u32 i, u32 iParent){
  JsonNode *pNode = &pParse->aNode[i];
  u32 j;
  pParse->aUp[i] = iParent;
  switch( pNode->eType ){
    case JSON_ARRAY: {
      for(j=1; j<=pNode->n; j += jsonNodeSize(pNode+j)){
        jsonParseFillInParentage(pParse, i+j, i);
      }
      break;
    }
    case JSON_OBJECT: {
      for(j=1; j<=pNode->n; j += jsonNodeSize(pNode+j+1)+1){
        pParse->aUp[i+j] = i;
        jsonParseFillInParentage(pParse, i+j+1, i);
      }
      break;
    }
    default: {
      break;
    }
  }
}